

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O1

BOOL CONTEXT_SetThreadContext(DWORD dwProcessId,pthread_t self,CONTEXT *lpContext)

{
  uint __errnum;
  FILE *__stream;
  DWORD DVar1;
  long lVar2;
  uint *puVar3;
  char *pcVar4;
  undefined8 uVar5;
  char *__format;
  DWORD64 local_d0;
  pt_regs ptrace_registers;
  
  if (lpContext == (CONTEXT *)0x0) {
    DVar1 = 0x3e6;
    if (!PAL_InitializeChakraCoreCalled) {
      abort();
    }
  }
  else {
    DVar1 = GetCurrentProcessId();
    if (DVar1 == dwProcessId) {
      fprintf(_stderr,"ASSERTION (%s, line %d) %s %s\n",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/context.cpp"
              ,0x1e9,"0","");
      fflush(_stderr);
      abort();
    }
    if ((lpContext->ContextFlags & 3) == 0) {
      return 1;
    }
    lVar2 = ptrace(PTRACE_GETREGS,dwProcessId,&local_d0,0);
    if (lVar2 == -1) {
      __format = "Failed ptrace(PT_GETREGS, processId:%d) errno:%d (%s)\n";
      uVar5 = 0x1fa;
    }
    else {
      if ((lpContext->ContextFlags & 1) != 0) {
        ptrace_registers.r12 = lpContext->Rbp;
        ptrace_registers.orig_rax = lpContext->Rip;
        ptrace_registers.rip = (unsigned_long)lpContext->SegCs;
        ptrace_registers.cs = (unsigned_long)lpContext->EFlags;
        ptrace_registers.eflags = lpContext->Rsp;
      }
      if ((lpContext->ContextFlags & 2) != 0) {
        ptrace_registers.rsi = lpContext->Rdi;
        ptrace_registers.rdx = lpContext->Rsi;
        ptrace_registers.rbp = lpContext->Rbx;
        ptrace_registers.rcx = lpContext->Rdx;
        ptrace_registers.rax = lpContext->Rcx;
        ptrace_registers.r8 = lpContext->Rax;
        ptrace_registers.r9 = lpContext->R8;
        ptrace_registers.r10 = lpContext->R9;
        ptrace_registers.r11 = lpContext->R10;
        ptrace_registers.rbx = lpContext->R11;
        ptrace_registers.r13 = lpContext->R12;
        ptrace_registers.r14 = lpContext->R13;
        ptrace_registers.r15 = lpContext->R14;
        local_d0 = lpContext->R15;
      }
      lVar2 = ptrace(PTRACE_SETREGS,dwProcessId,&local_d0,0);
      if (lVar2 != -1) {
        return 1;
      }
      __format = "Failed ptrace(PT_SETREGS, processId:%d) errno:%d (%s)\n";
      uVar5 = 0x219;
    }
    fprintf(_stderr,"] %s %s:%d","CONTEXT_SetThreadContext",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/thread/context.cpp"
            ,uVar5);
    __stream = _stderr;
    puVar3 = (uint *)__errno_location();
    __errnum = *puVar3;
    pcVar4 = strerror(__errnum);
    fprintf(__stream,__format,dwProcessId,(ulong)__errnum,pcVar4);
    DVar1 = 0x54f;
  }
  SetLastError(DVar1);
  return 0;
}

Assistant:

BOOL
CONTEXT_SetThreadContext(
           DWORD dwProcessId,
           pthread_t self,
           CONST CONTEXT *lpContext)
{
    BOOL ret = FALSE;

    if (lpContext == NULL)
    {
        ERROR("Invalid lpContext parameter value\n");
        SetLastError(ERROR_NOACCESS);
        goto EXIT;
    }

    if (dwProcessId != GetCurrentProcessId())
    {
        // GetThreadContext() of a thread in another process
        ASSERT("Cross-process GetThreadContext() is not supported\n");
        SetLastError(ERROR_NOACCESS);
        goto EXIT;
    }

    if (self != pthread_self())
    {
        // hThread is in the current process, but isn't the current
        // thread.  Extract the CONTEXT from the Mach thread.

        mach_port_t mptPort;

        mptPort = pthread_mach_thread_np(self);

        ret = (CONTEXT_SetThreadContextOnPort(mptPort, lpContext) == KERN_SUCCESS);
    }
    else
    {
        MachSetThreadContext(const_cast<CONTEXT *>(lpContext));
        ASSERT("MachSetThreadContext should never return\n");
    }

EXIT:
    return ret;
}